

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

string * __thiscall
om::net::ip4_addr::to_string_abi_cxx11_(string *__return_storage_ptr__,ip4_addr *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  ip4_addr *local_18;
  ip4_addr *this_local;
  
  local_18 = this;
  this_local = (ip4_addr *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,(uint)(byte)this->_addr);
  std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(local_190,(uint)*(byte *)((long)&this->_addr + 1));
  std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(local_190,(uint)*(byte *)((long)&this->_addr + 2));
  std::operator<<(poVar1,'.');
  std::ostream::operator<<(local_190,(uint)*(byte *)((long)&this->_addr + 3));
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const
			{
				std::stringstream ss;
				ss << (_addr >> 0  & 0x000000ff) << '.';
				ss << (_addr >> 8  & 0x000000ff) << '.';
				ss << (_addr >> 16 & 0x000000ff) << '.';
				ss << (_addr >> 24 & 0x000000ff);
				return ss.str();
			}